

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O2

png_fixed_point
translate_gamma_flags(png_structrp png_ptr,png_fixed_point output_gamma,int is_screen)

{
  byte *pbVar1;
  png_fixed_point pVar2;
  png_fixed_point pVar3;
  
  if (output_gamma != -1) {
    if ((output_gamma == -50000) || (output_gamma == -2)) {
      pVar3 = 0x10175;
      pVar2 = 0x250ac;
      goto LAB_0027e761;
    }
    if (output_gamma != -100000) {
      return output_gamma;
    }
  }
  pbVar1 = (byte *)((long)&png_ptr->flags + 1);
  *pbVar1 = *pbVar1 | 0x10;
  pVar3 = 0xb18f;
  pVar2 = 220000;
LAB_0027e761:
  if (is_screen == 0) {
    pVar2 = pVar3;
  }
  return pVar2;
}

Assistant:

static png_fixed_point
translate_gamma_flags(png_structrp png_ptr, png_fixed_point output_gamma,
    int is_screen)
{
   /* Check for flag values.  The main reason for having the old Mac value as a
    * flag is that it is pretty near impossible to work out what the correct
    * value is from Apple documentation - a working Mac system is needed to
    * discover the value!
    */
   if (output_gamma == PNG_DEFAULT_sRGB ||
      output_gamma == PNG_FP_1 / PNG_DEFAULT_sRGB)
   {
      /* If there is no sRGB support this just sets the gamma to the standard
       * sRGB value.  (This is a side effect of using this function!)
       */
#     ifdef PNG_READ_sRGB_SUPPORTED
         png_ptr->flags |= PNG_FLAG_ASSUME_sRGB;
#     else
         PNG_UNUSED(png_ptr)
#     endif
      if (is_screen != 0)
         output_gamma = PNG_GAMMA_sRGB;
      else
         output_gamma = PNG_GAMMA_sRGB_INVERSE;
   }

   else if (output_gamma == PNG_GAMMA_MAC_18 ||
      output_gamma == PNG_FP_1 / PNG_GAMMA_MAC_18)
   {
      if (is_screen != 0)
         output_gamma = PNG_GAMMA_MAC_OLD;
      else
         output_gamma = PNG_GAMMA_MAC_INVERSE;
   }

   return output_gamma;
}